

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Pring *pPVar6;
  int *piVar7;
  int *piVar8;
  pointer pnVar9;
  int32_t iVar10;
  int *piVar11;
  Pring *pPVar12;
  long lVar13;
  Pring *pPVar14;
  Pring *pPVar15;
  int iVar16;
  pointer pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  pointer pnVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  long lVar24;
  int iVar25;
  byte bVar26;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar26 = 0;
  pPVar12 = (this->temp).pivot_colNZ;
  pPVar15 = pPVar12[1].prev;
  pPVar14 = pPVar12 + 1;
  if (pPVar15 != pPVar14) {
    do {
      iVar1 = pPVar15->idx;
      piVar3 = (this->u).col.len;
      iVar2 = piVar3[iVar1];
      piVar3[iVar1] = iVar2 + -1;
      piVar4 = (this->u).col.idx;
      piVar5 = (this->u).col.start;
      iVar2 = piVar4[(long)piVar5[iVar1] + -1 + (long)iVar2];
      pPVar14 = (this->temp).pivot_row;
      pPVar6 = pPVar14[iVar2].next;
      pPVar6->prev = pPVar14[iVar2].prev;
      (pPVar14[iVar2].prev)->next = pPVar6;
      piVar7 = (this->u).row.len;
      iVar21 = piVar7[iVar2];
      piVar7[iVar2] = iVar21 + -1;
      piVar7 = (this->u).row.idx;
      lVar24 = (long)(this->u).row.start[iVar2] + -1 + (long)iVar21;
      iVar21 = piVar7[lVar24];
      iVar22 = (int)lVar24;
      iVar20 = iVar22;
      if (iVar21 != iVar1) {
        lVar24 = (long)iVar22;
        piVar8 = (this->temp).s_cact;
        pPVar14 = (this->temp).pivot_col;
        do {
          iVar20 = piVar5[iVar21];
          iVar16 = piVar3[iVar21];
          iVar25 = piVar8[iVar21];
          piVar8[iVar21] = iVar25 + -1;
          iVar25 = (iVar20 + iVar16) - iVar25;
          piVar11 = piVar4 + iVar25;
          do {
            piVar23 = piVar11;
            piVar11 = piVar23 + 1;
          } while (*piVar23 != iVar2);
          *piVar23 = piVar4[iVar25];
          piVar4[iVar25] = iVar2;
          iVar20 = piVar8[iVar21];
          pPVar6 = pPVar14[iVar21].next;
          pPVar6->prev = pPVar14[iVar21].prev;
          (pPVar14[iVar21].prev)->next = pPVar6;
          pPVar6 = pPVar12[iVar20].next;
          pPVar14[iVar21].next = pPVar6;
          pPVar6->prev = pPVar14 + iVar21;
          pPVar14[iVar21].prev = pPVar12 + iVar20;
          pPVar12[iVar20].next = pPVar14 + iVar21;
          iVar21 = piVar7[lVar24 + -1];
          lVar24 = lVar24 + -1;
        } while (iVar21 != iVar1);
        iVar20 = (int)lVar24;
      }
      iVar21 = (this->temp).stage;
      (this->temp).stage = iVar21 + 1;
      pnVar9 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar17 = pnVar9 + lVar24;
      pnVar18 = &local_b0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = pnVar9[lVar24].m_backend.exp;
      local_b0.m_backend.neg = pnVar9[lVar24].m_backend.neg;
      local_b0.m_backend.fpclass = pnVar9[lVar24].m_backend.fpclass;
      local_b0.m_backend.prec_elem = pnVar9[lVar24].m_backend.prec_elem;
      setPivot(this,iVar21,iVar1,iVar2,&local_b0);
      piVar3 = (this->u).row.idx;
      piVar3[lVar24] = piVar3[iVar22];
      pnVar9 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar17 = pnVar9 + iVar22;
      pnVar19 = pnVar9 + lVar24;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      pnVar9[lVar24].m_backend.exp = pnVar9[iVar22].m_backend.exp;
      pnVar9[lVar24].m_backend.neg = pnVar9[iVar22].m_backend.neg;
      iVar10 = pnVar9[iVar22].m_backend.prec_elem;
      pnVar9[lVar24].m_backend.fpclass = pnVar9[iVar22].m_backend.fpclass;
      pnVar9[lVar24].m_backend.prec_elem = iVar10;
      iVar1 = (this->u).row.start[iVar2];
      if (iVar1 < iVar20) {
        piVar3 = (this->u).row.idx;
        piVar4 = (this->u).col.idx;
        piVar5 = (this->u).col.len;
        piVar7 = (this->u).col.start;
        piVar8 = (this->temp).s_cact;
        pPVar14 = (this->temp).pivot_col;
        pPVar12 = (this->temp).pivot_colNZ;
        lVar24 = (long)iVar20;
        do {
          iVar21 = piVar3[lVar24 + -1];
          lVar24 = lVar24 + -1;
          iVar20 = piVar7[iVar21];
          iVar22 = piVar5[iVar21];
          iVar16 = piVar8[iVar21];
          piVar8[iVar21] = iVar16 + -1;
          iVar16 = (iVar20 + iVar22) - iVar16;
          piVar11 = piVar4 + iVar16;
          do {
            piVar23 = piVar11;
            piVar11 = piVar23 + 1;
          } while (*piVar23 != iVar2);
          *piVar23 = piVar4[iVar16];
          piVar4[iVar16] = iVar2;
          iVar20 = piVar8[iVar21];
          pPVar6 = pPVar14[iVar21].next;
          pPVar6->prev = pPVar14[iVar21].prev;
          (pPVar14[iVar21].prev)->next = pPVar6;
          pPVar6 = pPVar12[iVar20].next;
          pPVar14[iVar21].next = pPVar6;
          pPVar6->prev = pPVar14 + iVar21;
          pPVar14[iVar21].prev = pPVar12 + iVar20;
          pPVar12[iVar20].next = pPVar14 + iVar21;
        } while (iVar1 < lVar24);
      }
      pPVar15 = pPVar15->prev;
      pPVar12 = (this->temp).pivot_colNZ;
      pPVar14 = pPVar12 + 1;
    } while (pPVar15 != pPVar14);
  }
  pPVar12[1].next = pPVar12 + 1;
  pPVar12[1].prev = pPVar14;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}